

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int AF_AActor_TryMove(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *thing;
  bool bVar5;
  DVector2 local_40;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00416a4e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    thing = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (thing != (AActor *)0x0) {
        pPVar3 = (thing->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (thing->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00416a4e;
        }
        goto LAB_0041699d;
      }
    }
    else if (thing != (AActor *)0x0) goto LAB_00416a3e;
    thing = (AActor *)0x0;
LAB_0041699d:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if (numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar4 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\0') {
                local_40.X = (double)param[1].field_0.field_1.a;
                local_40.Y = (double)param[2].field_0.field_1.a;
                iVar2 = 0;
                bVar5 = P_TryMove(thing,&local_40,param[3].field_0.i,(secplane_t *)0x0);
                if (0 < numret) {
                  if (ret == (VMReturn *)0x0) {
                    __assert_fail("ret != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                  ,0xa45,
                                  "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                 );
                  }
                  if (ret->RegType != '\0') {
                    __assert_fail("RegType == REGT_INT",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                  ,0x13f,"void VMReturn::SetInt(int)");
                  }
                  *(uint *)ret->Location = (uint)bVar5;
                  iVar2 = 1;
                }
                return iVar2;
              }
              pcVar4 = "param[paramnum].Type == REGT_INT";
            }
            __assert_fail(pcVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                          ,0xa44,
                          "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar4 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                      ,0xa43,
                      "int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0xa42,"int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00416a3e:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00416a4e:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0xa41,"int AF_AActor_TryMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TryMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_INT(dropoff);
	ACTION_RETURN_BOOL(P_TryMove(self, DVector2(x, y), dropoff));
}